

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::MapFieldGenerator::GenerateMembers
          (MapFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  Descriptor *pDVar1;
  FieldDescriptor *descriptor;
  FieldDescriptor *descriptor_00;
  Options *pOVar2;
  FieldGeneratorBase *pFVar3;
  FieldGeneratorBase *pFVar4;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string local_68;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  descriptor = Descriptor::map_key(pDVar1);
  pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  descriptor_00 = Descriptor::map_value(pDVar1);
  FieldGeneratorBase::type_name_abi_cxx11_(&local_68,&this->super_FieldGeneratorBase,descriptor);
  vars = &(this->super_FieldGeneratorBase).variables_;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>(&local_48,vars,(char (*) [14])"key_type_name");
  std::__cxx11::string::operator=
            ((string *)((long)local_48.first.field_1.slot_ + 0x10),(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  FieldGeneratorBase::type_name_abi_cxx11_(&local_68,&this->super_FieldGeneratorBase,descriptor_00);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[16]>(&local_48,vars,(char (*) [16])"value_type_name");
  std::__cxx11::string::operator=
            ((string *)((long)local_48.first.field_1.slot_ + 0x10),(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pOVar2 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  pFVar3 = CreateFieldGenerator(descriptor,1,pOVar2);
  pOVar2 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  pFVar4 = CreateFieldGenerator(descriptor_00,2,pOVar2);
  text_00._M_str =
       "private static readonly pbc::MapField<$key_type_name$, $value_type_name$>.Codec _map_$name$_codec\n    = new pbc::MapField<$key_type_name$, $value_type_name$>.Codec("
  ;
  text_00._M_len = 0xa4;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar3,printer);
  text._M_str = ", ";
  text._M_len = 2;
  io::Printer::Print<>(printer,text);
  (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar4,printer);
  text_01._M_str =
       ", $tag$);\nprivate readonly pbc::MapField<$key_type_name$, $value_type_name$> $name$_ = new pbc::MapField<$key_type_name$, $value_type_name$>();\n"
  ;
  text_01._M_len = 0x90;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  pOVar2 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  WritePropertyDocComment(printer,pOVar2,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
  text_02._M_str =
       "$access_level$ pbc::MapField<$key_type_name$, $value_type_name$> $property_name$ {\n  get { return $name$_; }\n}\n"
  ;
  text_02._M_len = 0x6f;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar4);
  (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar3);
  return;
}

Assistant:

void MapFieldGenerator::GenerateMembers(io::Printer* printer) {
  const FieldDescriptor* key_descriptor =
      descriptor_->message_type()->map_key();
  const FieldDescriptor* value_descriptor =
      descriptor_->message_type()->map_value();
  variables_["key_type_name"] = type_name(key_descriptor);
  variables_["value_type_name"] = type_name(value_descriptor);
  std::unique_ptr<FieldGeneratorBase> key_generator(
      CreateFieldGenerator(key_descriptor, 1, this->options()));
  std::unique_ptr<FieldGeneratorBase> value_generator(
      CreateFieldGenerator(value_descriptor, 2, this->options()));

  printer->Print(
    variables_,
    "private static readonly pbc::MapField<$key_type_name$, $value_type_name$>.Codec _map_$name$_codec\n"
    "    = new pbc::MapField<$key_type_name$, $value_type_name$>.Codec(");
  key_generator->GenerateCodecCode(printer);
  printer->Print(", ");
  value_generator->GenerateCodecCode(printer);
  printer->Print(
    variables_,
    ", $tag$);\n"
    "private readonly pbc::MapField<$key_type_name$, $value_type_name$> $name$_ = new pbc::MapField<$key_type_name$, $value_type_name$>();\n");
  WritePropertyDocComment(printer, options(), descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ pbc::MapField<$key_type_name$, $value_type_name$> $property_name$ {\n"
    "  get { return $name$_; }\n"
    "}\n");
}